

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTableGen.cpp
# Opt level: O2

void __thiscall
SGParser::Generator::ParseTableGen::AllocateTables
          (ParseTableGen *this,size_t stateCount,size_t terminalCount,size_t nonTerminalCount)

{
  vector<unsigned_short_*,_std::allocator<unsigned_short_*>_> *pvVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  bool bVar6;
  value_type local_40;
  uint16_t *newActionTable;
  uint16_t *newGotoTable;
  
  ParseTable::FreeTables(&this->super_ParseTable);
  (this->super_ParseTable).ActionWidth = terminalCount;
  pvVar1 = &(this->super_ParseTable).ActionTable;
  std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::reserve(pvVar1,stateCount);
  lVar3 = (this->super_ParseTable).ActionWidth * stateCount;
  uVar2 = lVar3 * 2;
  uVar4 = 0xffffffffffffffff;
  if (-1 < lVar3) {
    uVar4 = uVar2;
  }
  local_40 = (value_type)operator_new__(uVar4);
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 2) {
    *(undefined2 *)((long)local_40 + uVar4) = 0;
  }
  sVar5 = stateCount;
  while (bVar6 = sVar5 != 0, sVar5 = sVar5 - 1, bVar6) {
    std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::push_back(pvVar1,&local_40);
    local_40 = local_40 + (this->super_ParseTable).ActionWidth;
  }
  (this->super_ParseTable).GotoWidth = nonTerminalCount;
  pvVar1 = &(this->super_ParseTable).GotoTable;
  std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::reserve(pvVar1,stateCount);
  lVar3 = (this->super_ParseTable).GotoWidth * stateCount;
  uVar2 = lVar3 * 2;
  uVar4 = 0xffffffffffffffff;
  if (-1 < lVar3) {
    uVar4 = uVar2;
  }
  newActionTable = (uint16_t *)operator_new__(uVar4);
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 2) {
    *(undefined2 *)((long)newActionTable + uVar4) = 0xffff;
  }
  while (bVar6 = stateCount != 0, stateCount = stateCount - 1, bVar6) {
    std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::push_back
              (pvVar1,&newActionTable);
    newActionTable = newActionTable + (this->super_ParseTable).GotoWidth;
  }
  return;
}

Assistant:

void ParseTableGen::AllocateTables(size_t stateCount, size_t terminalCount,
                                   size_t nonTerminalCount) {
    FreeTables();

    // *** Allocate memory for the action table

    ActionWidth = terminalCount;
    ActionTable.reserve(stateCount);

    const auto newActionSize  = stateCount * ActionWidth;
    auto       newActionTable = new uint16_t[newActionSize];
    std::fill(newActionTable, newActionTable + newActionSize, uint16_t(0u));

    for (size_t i = 0u; i < stateCount; ++i, newActionTable += ActionWidth)
        ActionTable.push_back(newActionTable);

    // *** Allocate memory for the goto table

    GotoWidth = nonTerminalCount;
    GotoTable.reserve(stateCount);

    const auto newGotoSize  = stateCount * GotoWidth;
    auto       newGotoTable = new uint16_t[newGotoSize];
    std::fill(newGotoTable, newGotoTable + newGotoSize, EmptyGoto);

    for (size_t i = 0u; i < stateCount; ++i, newGotoTable += GotoWidth)
        GotoTable.push_back(newGotoTable);
}